

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_util.h
# Opt level: O0

char * uo_utf8_append(char *dst,uint32_t codepoint)

{
  byte bVar1;
  uint32_t codepoint_local;
  char *dst_local;
  
  bVar1 = (byte)codepoint;
  if (codepoint < 0x80) {
    dst_local = dst + 1;
    *dst = bVar1 & 0x7f;
  }
  else if (codepoint < 0x800) {
    *dst = (byte)(codepoint >> 6) | 0xc0;
    dst_local = dst + 2;
    dst[1] = bVar1 & 0x3f | 0x80;
  }
  else if (codepoint < 0x10000) {
    *dst = (byte)(codepoint >> 0xc) | 0xe0;
    dst[1] = (byte)(codepoint >> 6) & 0x3f | 0x80;
    dst_local = dst + 3;
    dst[2] = bVar1 & 0x3f | 0x80;
  }
  else if (codepoint < 0x110000) {
    *dst = (byte)(codepoint >> 0x12) | 0xf0;
    dst[1] = (byte)(codepoint >> 0xc) & 0x3f | 0x80;
    dst[2] = (byte)(codepoint >> 6) & 0x3f | 0x80;
    dst_local = dst + 4;
    dst[3] = bVar1 & 0x3f | 0x80;
  }
  else {
    dst_local = (char *)0x0;
  }
  return dst_local;
}

Assistant:

static char *uo_utf8_append(
    char *dst, 
    uint32_t codepoint)
{
    if (codepoint < 0x80)
    {
        *dst++ = (char)(codepoint & 0x7f);
        return dst;
    }

    if (codepoint < 0x800)
    {
        *dst++ = (char)(0xc0 | (codepoint >> 6));
        *dst++ = (char)(0x80 | (codepoint & 0x3f));
        return dst;
    }

    if (codepoint < 0x10000)
    {
        *dst++ = (char)(0xe0 | (codepoint >> 12));
        *dst++ = (char)(0x80 | ((codepoint >> 6) & 0x3f));
        *dst++ = (char)(0x80 | (codepoint & 0x3f));
        return dst;
    }

    if (codepoint < 0x110000) 
    {
        *dst++ = (char)(0xf0 | (codepoint >> 18));
        *dst++ = (char)(0x80 | ((codepoint >> 12) & 0x3f));
        *dst++ = (char)(0x80 | ((codepoint >> 6) & 0x3f));
        *dst++ = (char)(0x80 | (codepoint & 0x3f));
        return dst;
    }

    return NULL;
}